

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O3

bool __thiscall QHttpNetworkRequest::methodIsIdempotent(QHttpNetworkRequest *this)

{
  Operation OVar1;
  long *plVar2;
  long in_FS_OFFSET;
  undefined1 local_1c [8];
  undefined1 local_14 [8];
  undefined1 local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  OVar1 = ((this->d).d.ptr)->operation;
  if (OVar1 - Get < 6) {
    plVar2 = (long *)local_1c;
    switch(OVar1) {
    case Get:
      break;
    case Head:
      plVar2 = (long *)(local_1c + 4);
      break;
    default:
      goto switchD_0020d455_caseD_3;
    case Put:
      plVar2 = (long *)local_14;
      break;
    case Trace:
      plVar2 = (long *)(local_14 + 4);
    }
  }
  else {
switchD_0020d455_caseD_3:
    plVar2 = (long *)local_c;
    if (OVar1 != Options) {
      plVar2 = &local_8;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return plVar2 != &local_8;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpNetworkRequest::methodIsIdempotent() const
{
    using Op = Operation;
    constexpr auto knownSafe = std::array{ Op::Get, Op::Head, Op::Put, Op::Trace, Op::Options };
    return std::any_of(knownSafe.begin(), knownSafe.end(),
                       [currentOp = d->operation](auto op) { return op == currentOp; });
}